

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall stringToUnits_hartree_Test::TestBody(stringToUnits_hartree_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  AssertHelper local_d0;
  Message local_c8;
  allocator local_b9;
  string local_b8;
  precise_unit local_98;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70 [3];
  allocator local_51;
  string local_50;
  precise_unit local_30;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  stringToUnits_hartree_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"Eh",&local_51);
  uVar2 = units::getDefaultFlags();
  local_30 = units::unit_from_string(&local_50,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_20,"precise::energy::hartree","unit_from_string(\"Eh\")",
             (precise_unit *)units::precise::energy::hartree,&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x266,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"E_h",&local_b9);
  uVar2 = units::getDefaultFlags();
  local_98 = units::unit_from_string(&local_b8,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_88,"precise::energy::hartree","unit_from_string(\"E_h\")",
             (precise_unit *)units::precise::energy::hartree,&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x267,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  return;
}

Assistant:

TEST(stringToUnits, hartree)
{
    EXPECT_EQ(precise::energy::hartree, unit_from_string("Eh"));
    EXPECT_EQ(precise::energy::hartree, unit_from_string("E_h"));
}